

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O1

TestCaseGroup * vkt::image::createImageSizeTests(TestContext *testCtx)

{
  IVec3 *imageLayerSize;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ImageType imageType;
  undefined4 uVar2;
  uint uVar3;
  TestNode *this;
  TestNode *this_00;
  TestNode *node;
  ImageType imageType_00;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  Texture texture;
  ostringstream str;
  _func_int **local_238;
  int local_230;
  undefined8 local_22c;
  int local_224;
  long local_220;
  TestContext *local_218;
  ulong local_210;
  long local_208;
  long local_200;
  char *local_1f8;
  long local_1f0;
  char *local_1e8;
  long local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  int local_1b4 [3];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this = (TestNode *)operator_new(0x70);
  local_218 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"image_size","imageSize() cases");
  paVar1 = &local_1a8[0].field_2;
  local_220 = 0;
  do {
    this_00 = (TestNode *)operator_new(0x70);
    imageType = *(ImageType *)((anonymous_namespace)::s_imageTypes + local_220 * 4);
    getImageTypeName_abi_cxx11_(local_1a8,(image *)(ulong)imageType,imageType_00);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_00,local_218,local_1a8[0]._M_dataplus._M_p,"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    local_210 = (ulong)imageType;
    lVar7 = 0;
    do {
      local_1e8 = "readonly_";
      if (lVar7 == 1) {
        local_1e8 = "";
      }
      local_1f0 = (ulong)(lVar7 != 1) * 9;
      local_1f8 = "writeonly_";
      if (lVar7 == 0) {
        local_1f8 = "";
      }
      local_200 = 10;
      if (lVar7 == 0) {
        local_200 = 0;
      }
      lVar6 = 0;
      local_208 = lVar7;
      do {
        if (imageType < IMAGE_TYPE_LAST) {
          imageLayerSize = (IVec3 *)(&(anonymous_namespace)::s_baseImageSizes + lVar6 * 3);
          switch((long)&switchD_007503b2::switchdataD_00b67cb0 +
                 (long)(int)(&switchD_007503b2::switchdataD_00b67cb0)[local_210]) {
          default:
            local_1a8[0]._M_dataplus._M_p._0_4_ = imageLayerSize->m_data[0];
            local_1a8[0]._M_dataplus._M_p._4_4_ = 1;
            local_1a8[0]._M_string_length._0_4_ = 1;
            Texture::Texture((Texture *)&local_238,imageType,(IVec3 *)local_1a8,1,1);
            break;
          case 0x7503f0:
            local_1a8[0]._M_dataplus._M_p._0_4_ = (int)*(undefined8 *)imageLayerSize->m_data;
            local_1a8[0]._M_dataplus._M_p._4_4_ =
                 (int)((ulong)*(undefined8 *)imageLayerSize->m_data >> 0x20);
            local_1a8[0]._M_string_length._0_4_ = 1;
            Texture::Texture((Texture *)&local_238,IMAGE_TYPE_2D_ARRAY,(IVec3 *)local_1a8,
                             *(int *)(&DAT_00b67cf8 + lVar6 * 0xc),1);
            break;
          case 0x750426:
            local_1a8[0]._M_dataplus._M_p._0_4_ = imageLayerSize->m_data[0];
            local_1a8[0]._M_dataplus._M_p._4_4_ = 1;
            local_1a8[0]._M_string_length._0_4_ = 1;
            Texture::Texture((Texture *)&local_238,IMAGE_TYPE_1D_ARRAY,(IVec3 *)local_1a8,
                             *(int *)(&DAT_00b67cf4 + lVar6 * 0xc),1);
            break;
          case 0x750461:
            local_1a8[0]._M_dataplus._M_p._0_4_ = (int)*(undefined8 *)imageLayerSize->m_data;
            local_1a8[0]._M_dataplus._M_p._4_4_ =
                 (int)((ulong)*(undefined8 *)imageLayerSize->m_data >> 0x20);
            local_1a8[0]._M_string_length._0_4_ = 1;
            Texture::Texture((Texture *)&local_238,IMAGE_TYPE_2D,(IVec3 *)local_1a8,1,1);
            break;
          case 0x750499:
            local_1a8[0]._M_dataplus._M_p._0_4_ = imageLayerSize->m_data[0];
            local_1a8[0]._M_string_length._0_4_ = 1;
            local_1a8[0]._M_dataplus._M_p._4_4_ = (int)local_1a8[0]._M_dataplus._M_p;
            Texture::Texture((Texture *)&local_238,IMAGE_TYPE_CUBE_ARRAY,(IVec3 *)local_1a8,0xc,1);
            break;
          case 0x7504d6:
            Texture::Texture((Texture *)&local_238,IMAGE_TYPE_3D,imageLayerSize,1,1);
            break;
          case 0x7504f2:
            local_1a8[0]._M_dataplus._M_p._0_4_ = imageLayerSize->m_data[0];
            local_1a8[0]._M_string_length._0_4_ = 1;
            local_1a8[0]._M_dataplus._M_p._4_4_ = (int)local_1a8[0]._M_dataplus._M_p;
            Texture::Texture((Texture *)&local_238,IMAGE_TYPE_CUBE,(IVec3 *)local_1a8,6,1);
          }
        }
        else {
          local_1a8[0]._M_string_length._0_4_ = 0;
          local_1a8[0]._M_dataplus._M_p._0_4_ = 0;
          local_1a8[0]._M_dataplus._M_p._4_4_ = 0;
          Texture::Texture((Texture *)&local_238,IMAGE_TYPE_LAST,(IVec3 *)local_1a8,0,1);
        }
        node = (TestNode *)operator_new(0x90);
        uVar2 = (&(anonymous_namespace)::s_flags)[lVar7];
        local_1e0 = lVar6;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1e8,local_1f0)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1f8,local_200)
        ;
        uVar3 = Texture::dimension((Texture *)&local_238);
        if (0 < (int)uVar3) {
          uVar4 = 0;
          do {
            pcVar5 = "";
            if (uVar4 != 0) {
              pcVar5 = "x";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,pcVar5,(ulong)(uVar4 != 0));
            Texture::size((Texture *)&local_238);
            std::ostream::operator<<(local_1a8,local_1b4[uVar4]);
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
        tcu::TestCase::TestCase
                  ((TestCase *)node,local_218,(char *)local_1d8,local_1a8[0]._M_dataplus._M_p);
        node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d626f8;
        node[1]._vptr_TestNode = local_238;
        *(int *)&node[1].m_testCtx = local_230;
        *(undefined8 *)((long)&node[1].m_testCtx + 4) = local_22c;
        *(int *)((long)&node[1].m_name._M_dataplus._M_p + 4) = local_224;
        *(undefined4 *)&node[1].m_name._M_string_length = 0x6d;
        *(byte *)((long)&node[1].m_name._M_string_length + 4) = (byte)uVar2 & 1;
        *(byte *)((long)&node[1].m_name._M_string_length + 5) = (byte)uVar2 >> 1 & 1;
        tcu::TestNode::addChild(this_00,node);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        lVar6 = local_1e0;
        lVar7 = local_208;
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    tcu::TestNode::addChild(this,this_00);
    local_220 = local_220 + 1;
  } while (local_220 != 8);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createImageSizeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "image_size", "imageSize() cases"));

	const VkFormat format = VK_FORMAT_R32G32B32A32_SFLOAT;

	for (int imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(s_imageTypes); ++imageTypeNdx)
	{
		de::MovePtr<tcu::TestCaseGroup> imageGroup(new tcu::TestCaseGroup(testCtx, getImageTypeName(s_imageTypes[imageTypeNdx]).c_str(), ""));

		for (int flagNdx = 0; flagNdx < DE_LENGTH_OF_ARRAY(s_flags); ++flagNdx)
		for (int imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(s_baseImageSizes); ++imageSizeNdx)
		{
			const Texture texture = getTexture(s_imageTypes[imageTypeNdx], s_baseImageSizes[imageSizeNdx]);
			imageGroup->addChild(new SizeTest(testCtx, getCaseName(texture, s_flags[flagNdx]), "", texture, format, s_flags[flagNdx]));
		}

		testGroup->addChild(imageGroup.release());
	}
	return testGroup.release();
}